

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O3

int lws_role_call_adoption_bind(lws *wsi,int type,char *prot)

{
  lws_vhost *plVar1;
  char *name;
  int iVar2;
  lws_role_ops *plVar3;
  lws_role_ops **pplVar4;
  
  plVar1 = wsi->vhost;
  if (((plVar1->options & 0x400000) != 0) &&
     (name = plVar1->listen_accept_role, name != (char *)0x0)) {
    plVar3 = lws_role_by_name(name);
    if (prot == (char *)0x0) {
      prot = plVar1->listen_accept_protocol;
    }
    if (plVar3 == (lws_role_ops *)0x0) {
      _lws_log(1,"%s: can\'t find role \'%s\'\n","lws_role_call_adoption_bind",name);
    }
    else if (plVar3->adoption_bind != (_func_int_lws_ptr_int_char_ptr *)0x0) {
      iVar2 = (*plVar3->adoption_bind)(wsi,type,prot);
      if (iVar2 < 0) {
        return -1;
      }
      if (iVar2 != 0) {
        return 0;
      }
    }
    if (((uint)type >> 0x18 & 1) != 0) {
      _lws_log(0x10,"%s: leaving bound to role %s\n","lws_role_call_adoption_bind",
               wsi->role_ops->name);
      return 0;
    }
    _lws_log(2,"%s: adoption bind to role \'%s\', protocol \'%s\', type 0x%x, failed\n",
             "lws_role_call_adoption_bind",wsi->vhost->listen_accept_role,prot,type);
  }
  if (available_roles[0] != (lws_role_ops *)0x0) {
    pplVar4 = available_roles;
    plVar3 = available_roles[0];
    do {
      pplVar4 = pplVar4 + 1;
      if ((plVar3->adoption_bind != (_func_int_lws_ptr_int_char_ptr *)0x0) &&
         (iVar2 = (*plVar3->adoption_bind)(wsi,type,prot), iVar2 != 0)) {
        return 0;
      }
      plVar3 = *pplVar4;
    } while (plVar3 != (lws_role_ops *)0x0);
  }
  iVar2 = rops_adoption_bind_raw_skt(wsi,type,prot);
  if ((iVar2 == 0) && (iVar2 = rops_adoption_bind_raw_file(wsi,type,prot), iVar2 == 0)) {
    return 1;
  }
  return 0;
}

Assistant:

int
lws_role_call_adoption_bind(struct lws *wsi, int type, const char *prot)
{
	int n;

	/*
	 * if the vhost is told to bind accepted sockets to a given role,
	 * then look it up by name and try to bind to the specific role.
	 */
	if (lws_check_opt(wsi->vhost->options,
			  LWS_SERVER_OPTION_ADOPT_APPLY_LISTEN_ACCEPT_CONFIG) &&
	    wsi->vhost->listen_accept_role) {
		const struct lws_role_ops *role =
			lws_role_by_name(wsi->vhost->listen_accept_role);

		if (!prot)
			prot = wsi->vhost->listen_accept_protocol;

		if (!role)
			lwsl_err("%s: can't find role '%s'\n", __func__,
				  wsi->vhost->listen_accept_role);

		if (role && role->adoption_bind) {
			n = role->adoption_bind(wsi, type, prot);
			if (n < 0)
				return -1;
			if (n) /* did the bind */
				return 0;
		}

		if (type & _LWS_ADOPT_FINISH) {
			lwsl_debug("%s: leaving bound to role %s\n", __func__,
				   wsi->role_ops->name);
			return 0;
		}


		lwsl_warn("%s: adoption bind to role '%s', "
			  "protocol '%s', type 0x%x, failed\n", __func__,
			  wsi->vhost->listen_accept_role, prot, type);
	}

	/*
	 * Otherwise ask each of the roles in order of preference if they
	 * want to bind to this accepted socket
	 */

	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (ar->adoption_bind && ar->adoption_bind(wsi, type, prot))
			return 0;
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;

	/* fall back to raw socket role if, eg, h1 not configured */

	if (role_ops_raw_skt.adoption_bind &&
	    role_ops_raw_skt.adoption_bind(wsi, type, prot))
		return 0;

	/* fall back to raw file role if, eg, h1 not configured */

	if (role_ops_raw_file.adoption_bind &&
	    role_ops_raw_file.adoption_bind(wsi, type, prot))
		return 0;

	return 1;
}